

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_rb_commit_write(ma_rb *pRB,size_t sizeInBytes,void *pBufferOut)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if ((pRB != (ma_rb *)0x0) &&
     ((void *)((ulong)(pRB->encodedWriteOffset & 0x7fffffff) + (long)pRB->pBuffer) == pBufferOut)) {
    uVar3 = (int)sizeInBytes + (pRB->encodedWriteOffset & 0x7fffffff);
    if (uVar3 <= pRB->subbufferSizeInBytes) {
      uVar1 = pRB->encodedWriteOffset & 0x80000000;
      uVar2 = uVar1 | uVar3;
      if (uVar3 == pRB->subbufferSizeInBytes) {
        uVar2 = uVar1 ^ 0x80000000;
      }
      LOCK();
      pRB->encodedWriteOffset = uVar2;
      UNLOCK();
      return 0;
    }
  }
  return -2;
}

Assistant:

MA_API ma_result ma_rb_commit_write(ma_rb* pRB, size_t sizeInBytes, void* pBufferOut)
{
    ma_uint32 writeOffset;
    ma_uint32 writeOffsetInBytes;
    ma_uint32 writeOffsetLoopFlag;
    ma_uint32 newWriteOffsetInBytes;
    ma_uint32 newWriteOffsetLoopFlag;

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Validate the buffer. */
    if (pBufferOut != ma_rb__get_write_ptr(pRB)) {
        return MA_INVALID_ARGS;
    }

    writeOffset = c89atomic_load_32(&pRB->encodedWriteOffset);
    ma_rb__deconstruct_offset(writeOffset, &writeOffsetInBytes, &writeOffsetLoopFlag);

    /* Check that sizeInBytes is correct. It should never go beyond the end of the buffer. */
    newWriteOffsetInBytes = (ma_uint32)(writeOffsetInBytes + sizeInBytes);
    if (newWriteOffsetInBytes > pRB->subbufferSizeInBytes) {
        return MA_INVALID_ARGS;    /* <-- sizeInBytes will cause the read offset to overflow. */
    }

    /* Move the read pointer back to the start if necessary. */
    newWriteOffsetLoopFlag = writeOffsetLoopFlag;
    if (newWriteOffsetInBytes == pRB->subbufferSizeInBytes) {
        newWriteOffsetInBytes = 0;
        newWriteOffsetLoopFlag ^= 0x80000000;
    }

    c89atomic_exchange_32(&pRB->encodedWriteOffset, ma_rb__construct_offset(newWriteOffsetLoopFlag, newWriteOffsetInBytes));
    return MA_SUCCESS;
}